

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::
holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::duplicate(holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this)

{
  holder<std::shared_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::stringstream>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::shared_ptr<std::__cxx11::stringstream>&>
                     ((allocator_type<cs_impl::any::holder<std::shared_ptr<std::__cxx11::stringstream>>,64ul,cs_impl::default_allocator_provider>
                       *)holder<std::shared_ptr<std::__cxx11::stringstream>>::allocator,&this->mDat)
  ;
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}